

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O3

BOOL __thiscall LASquadtree::get_intersected_cells(LASquadtree *this)

{
  long *plVar1;
  
  this->next_cell_index = 0;
  plVar1 = (long *)this->current_cells;
  if (plVar1 != (long *)0x0) {
    return plVar1[1] != *plVar1;
  }
  return false;
}

Assistant:

BOOL LASquadtree::get_intersected_cells()
{
  next_cell_index = 0;
  if (current_cells == 0)
  {
    return FALSE;
  }
  if (((my_cell_vector*)current_cells)->size() == 0)
  {
    return FALSE;
  }
  return TRUE;
}